

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall booster::locale::date_time::date_time(date_time *this)

{
  calendar_facet *pcVar1;
  abstract_calendar *paVar2;
  locale *in_RDI;
  locale *__loc;
  string local_40 [48];
  locale local_10 [2];
  
  __loc = in_RDI;
  std::locale::locale(local_10);
  pcVar1 = std::use_facet<booster::locale::calendar_facet>(__loc);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)pcVar1 + 0x10))();
  hold_ptr<booster::locale::abstract_calendar>::hold_ptr
            ((hold_ptr<booster::locale::abstract_calendar> *)__loc,paVar2);
  std::locale::~locale(local_10);
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->
                     ((hold_ptr<booster::locale::abstract_calendar> *)in_RDI);
  time_zone::global_abi_cxx11_();
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

date_time::date_time() :
    impl_(std::use_facet<calendar_facet>(std::locale()).create_calendar())
{
    impl_->set_timezone(time_zone::global());
}